

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

void __thiscall BN::divmod(BN *this,BN *bn,BN *div,BN *mod)

{
  pointer *this_00;
  ushort uVar1;
  ushort uVar2;
  value_type vVar3;
  bool bVar4;
  uint uVar5;
  divide_by_zero *this_01;
  size_type sVar6;
  const_reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  long lVar10;
  uint uVar11;
  size_type local_110;
  size_t i_1;
  size_t i;
  bt4s x;
  bt2 r;
  bt2 q;
  size_t j;
  undefined1 local_e0 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> temp;
  size_t m;
  size_t n;
  undefined1 local_b0 [6];
  bt d;
  BN divider;
  BN dividend;
  BN local_68;
  BN local_50;
  BN *local_28;
  BN *mod_local;
  BN *div_local;
  BN *bn_local;
  BN *this_local;
  
  local_28 = mod;
  mod_local = div;
  div_local = bn;
  bn_local = this;
  bVar4 = is0(bn);
  if (bVar4) {
    this_01 = (divide_by_zero *)__cxa_allocate_exception(0x10);
    divide_by_zero::divide_by_zero(this_01);
    __cxa_throw(this_01,&divide_by_zero::typeinfo,divide_by_zero::~divide_by_zero);
  }
  sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&div_local->ba);
  if (sVar6 == 1) {
    pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::front(&div_local->ba);
    divbase(&local_50,this,pvVar7);
    operator=(mod_local,&local_50);
    ~BN(&local_50);
    pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::front(&div_local->ba);
    modbase(&local_68,this,pvVar7);
    operator=(local_28,&local_68);
    ~BN(&local_68);
  }
  else {
    bVar4 = operator<(this,div_local);
    if (bVar4) {
      bn0();
      operator=(mod_local,
                (BN *)&dividend.ba.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      ~BN((BN *)&dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      operator=(local_28,this);
    }
    else {
      BN((BN *)&divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,this);
      BN((BN *)local_b0,div_local);
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::back(&div_local->ba);
      n._6_2_ = (short)(0x10000 / (ulong)(*pvVar7 + 1));
      if (n._6_2_ != 1) {
        mulbaseappr((BN *)&divider.ba.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(bt *)((long)&n + 6));
        mulbaseappr((BN *)local_b0,(bt *)((long)&n + 6));
      }
      sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0);
      this_00 = &divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00);
      temp.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)((sVar8 - sVar6) + 1);
      sVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00,sVar8 + 2);
      sVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0,sVar8 + 1);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (&mod_local->ba,
                 (long)temp.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)((long)&j + 7));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_e0,sVar6 + 1,
                 (allocator<unsigned_short> *)((long)&j + 7));
      std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)((long)&j + 7));
      for (_r = temp.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          _r <= temp.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage; _r = (pointer)((long)_r - 1)) {
        pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            &divider.ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_r + sVar6);
        uVar1 = *pvVar9;
        pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            &divider.ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)_r + (sVar6 - 1));
        uVar2 = *pvVar9;
        pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0,
                            sVar6 - 1);
        uVar5 = ((uint)uVar1 * 0x10000 + (uint)uVar2) / (uint)*pvVar9;
        pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            &divider.ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_r + sVar6);
        uVar1 = *pvVar9;
        pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            &divider.ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)_r + (sVar6 - 1));
        uVar2 = *pvVar9;
        pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0,
                            sVar6 - 1);
        uVar11 = ((uint)uVar1 * 0x10000 + (uint)uVar2) % (uint)*pvVar9;
        if (uVar5 == 0x10000) {
LAB_0011bf20:
          x._4_4_ = uVar5 - 1;
          pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0,
                              sVar6 - 1);
          uVar11 = *pvVar9 + uVar11;
          if (uVar11 < 0x10000) {
            pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0,
                                sVar6 - 2);
            uVar1 = *pvVar9;
            pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                &divider.ba.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)_r + (sVar6 - 2));
            if (uVar11 * 0x10000 + (uint)*pvVar9 < x._4_4_ * uVar1) {
              x._4_4_ = uVar5 - 2;
            }
          }
        }
        else {
          pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0,
                              sVar6 - 2);
          uVar1 = *pvVar9;
          pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              &divider.ba.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)_r + (sVar6 - 2));
          x._4_4_ = uVar5;
          if (uVar11 * 0x10000 + (uint)*pvVar9 < uVar5 * uVar1) goto LAB_0011bf20;
        }
        if (x._4_4_ == 0) {
          pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (&mod_local->ba,(size_type)_r);
          *pvVar9 = 0;
        }
        else {
          i = 0;
          for (i_1 = 0; i_1 < sVar6; i_1 = i_1 + 1) {
            pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                &divider.ba.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)_r + i_1);
            uVar1 = *pvVar9;
            pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b0,
                                i_1);
            lVar10 = (uVar1 + i) - (ulong)(x._4_4_ * *pvVar9);
            pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                &divider.ba.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)_r + i_1);
            *pvVar9 = (value_type)lVar10;
            i = lVar10 >> 0x10;
          }
          pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              &divider.ba.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_r + sVar6);
          uVar1 = *pvVar9;
          pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              &divider.ba.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_r + sVar6);
          *pvVar9 = (value_type)(uVar1 + i);
          if ((long)(uVar1 + i) < 0) {
            x._4_4_ = x._4_4_ - 1;
            i = 0;
            for (local_110 = 0; local_110 < sVar6; local_110 = local_110 + 1) {
              pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  &divider.ba.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (long)_r + local_110);
              uVar1 = *pvVar9;
              pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  local_b0,local_110);
              lVar10 = (ulong)*pvVar9 + uVar1 + i;
              pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  &divider.ba.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (long)_r + local_110);
              *pvVar9 = (value_type)lVar10;
              i = lVar10 >> 0x10;
            }
            pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                &divider.ba.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)_r + sVar6
                               );
            vVar3 = *pvVar9;
            pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                &divider.ba.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)_r + sVar6
                               );
            *pvVar9 = vVar3 + (short)i;
          }
          pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (&mod_local->ba,(size_type)_r);
          *pvVar9 = (value_type)x._4_4_;
        }
      }
      anon_unknown.dwarf_102a0::Norm(&mod_local->ba);
      anon_unknown.dwarf_102a0::Norm
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 &divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (n._6_2_ != 1) {
        divbaseappr((BN *)&divider.ba.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(bt *)((long)&n + 6));
      }
      operator=(local_28,(BN *)&divider.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_e0);
      ~BN((BN *)local_b0);
      ~BN((BN *)&divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

void BN::divmod(const BN& bn, BN& div, BN& mod) const
{
    if(bn.is0())
        throw divide_by_zero();

    if(bn.ba.size() == 1) {
        div = move(this -> divbase(bn.ba.front()));
        mod = move(this -> modbase(bn.ba.front()));
        return;
    }

    if(*this < bn) {
        div = BN::bn0();
        mod = *this;
        return;
    }

    BN dividend(*this);
    BN divider(bn);

    bt d = bsize  / (bn.ba.back() + 1);
    if (d != 1) {
        dividend.mulbaseappr(d);
        divider.mulbaseappr(d);
    }

    size_t n = divider.ba.size();
    size_t m = dividend.ba.size() - n + 1;

    dividend.ba.resize(dividend.ba.size() + 2);
    divider.ba.resize(divider.ba.size() + 1);

    div.ba.resize(m + 1);

    vector<bt> temp(n + 1);
    for (size_t j = m; j <= m; --j) {
        bt2 q = (dividend.ba[j + n] * bsize + dividend.ba[j + n - 1]) / divider.ba[n-1];
        bt2 r = (dividend.ba[j + n] * bsize + dividend.ba[j + n - 1]) % divider.ba[n-1];

        if (q == bsize || q * divider.ba[n-2] > bsize * r + dividend.ba[j + n - 2]) {
            --q;
            r += divider.ba[n-1];
            if (r < bsize && q * divider.ba[n-2] > bsize * r + dividend.ba[j + n - 2])
                --q;
        }

        if (!q) {
            div.ba[j] = 0;
            continue;
        }

        bt4s x = 0;
        for (size_t i = 0; i < n; ++i) {
            x += dividend.ba[j + i];
            x -= q * divider.ba[i];
            dividend.ba[j + i] = x;
            x >>= bz8;
        }
        x += dividend.ba[j + n];
        dividend.ba[j + n] = x;

        // If `x' is negative, than `q' is too large.
        // Decrement `q' and update `dividend'.
        if (x < 0) {
            --q;
            x = 0;
            for (size_t i = 0; i < n; ++i) {
                x += dividend.ba[j + i];
                x += divider.ba[i];
                dividend.ba[j + i] = x;
                x >>= bz8;
            }
            x += dividend.ba[j + n];
            dividend.ba[j + n] = x;
        }

        div.ba[j] = q;
    }
    Norm(div.ba);
    Norm(dividend.ba);

    if (d != 1)
        dividend.divbaseappr(d);
    mod = move(dividend);
}